

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

bool_t bf_put_float64_le(bfile_t *bfile,float64_t value)

{
  undefined8 in_RDI;
  anon_union_8_2_d8cf4852 data;
  uint8_t value_00;
  
  value_00 = (uint8_t)((ulong)in_RDI >> 0x38);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  bf_put_uint8((bfile_t *)data,value_00);
  return 1;
}

Assistant:

bool_t
bf_put_float64_le(
    bfile_t * bfile,
    float64_t value )
{
    union {
        float64_t real;
        uint8_t   bytes[8];
    } data;

    assert( bfile != NULL );
    data.real = value;

#ifndef WORDS_BIGENDIAN
    bf_put_uint8( bfile, data.bytes[0] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[3] );
    bf_put_uint8( bfile, data.bytes[4] );
    bf_put_uint8( bfile, data.bytes[5] );
    bf_put_uint8( bfile, data.bytes[6] );
    bf_put_uint8( bfile, data.bytes[7] );
#else /* WORDS_BIGENDIAN */
    bf_put_uint8( bfile, data.bytes[7] );
    bf_put_uint8( bfile, data.bytes[6] );
    bf_put_uint8( bfile, data.bytes[5] );
    bf_put_uint8( bfile, data.bytes[4] );
    bf_put_uint8( bfile, data.bytes[3] );
    bf_put_uint8( bfile, data.bytes[2] );
    bf_put_uint8( bfile, data.bytes[1] );
    bf_put_uint8( bfile, data.bytes[0] );
#endif /* WORDS_BIGENDIAN */

    return TRUE;
}